

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void gc_twist_tf_ref_to_tgt(gc_pose *x,gc_twist *xd,gc_twist *r)

{
  char *__assertion;
  uint __line;
  vector3 v_rxw;
  vector3 rxw;
  
  if (x == (gc_pose *)0x0) {
    __assertion = "x";
    __line = 99;
  }
  else if (xd == (gc_twist *)0x0) {
    __assertion = "xd";
    __line = 100;
  }
  else if (r == (gc_twist *)0x0) {
    __assertion = "r";
    __line = 0x65;
  }
  else {
    if (xd != r) {
      la_dcross_o((double *)x->translation,1,(double *)xd->angular_velocity,1,(double *)&rxw,1);
      la_daxpy_oe(3,-1.0,(double *)&rxw,1,(double *)xd->linear_velocity,1,(double *)&v_rxw,1);
      la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)xd->angular_velocity,1,
                   (double *)r->angular_velocity,1);
      la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)&v_rxw,1,(double *)r->linear_velocity,1);
      return;
    }
    __assertion = "xd != r";
    __line = 0x66;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,__line,
                "void gc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_twist *, struct gc_twist *)"
               );
}

Assistant:

void gc_twist_tf_ref_to_tgt(
        const struct gc_pose *x,
        const struct gc_twist *xd,
        struct gc_twist *r)
{
    assert(x);
    assert(xd);
    assert(r);
    assert(xd != r);

    // r x w
    struct vector3 rxw;
    la_dcross_o((double *)x->translation, 1,
            (double *)xd->angular_velocity, 1,
            (double *)&rxw, 1);

    // v - r x w
    struct vector3 v_rxw;
    la_daxpy_oe(3,
            -1.0, (double *)&rxw, 1,
            (double *)xd->linear_velocity, 1,
            (double *)&v_rxw, 1);

    // v' = E(v - r x w)
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)xd->angular_velocity, 1,
            (double *)r->angular_velocity, 1);

    // w' = E w
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)&v_rxw, 1,
            (double *)r->linear_velocity, 1);
}